

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall Js::ScriptContext::CleanupWeakReferenceDictionaries(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *ppIVar4;
  undefined1 local_40 [8];
  Iterator iter;
  
  if (this->isWeakReferenceDictionaryListCleared == false) {
    local_40 = (undefined1  [8])&this->weakReferenceDictionaryList;
    iter.list = (SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount> *)
                local_40;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      if (iter.list ==
          (SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      iter.list = (SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>
                   *)((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])iter.list == local_40) break;
      ppIVar4 = SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>::
                Iterator::Data((Iterator *)local_40);
      (**(*ppIVar4)->_vptr_IWeakReferenceDictionary)();
    }
  }
  return;
}

Assistant:

void ScriptContext::CleanupWeakReferenceDictionaries()
    {
        if (!isWeakReferenceDictionaryListCleared)
        {
            SListBase<JsUtil::IWeakReferenceDictionary*>::Iterator iter(&this->weakReferenceDictionaryList);

            while (iter.Next())
            {
                JsUtil::IWeakReferenceDictionary* weakReferenceDictionary = iter.Data();

                weakReferenceDictionary->Cleanup();
            }
        }
    }